

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

bool ON_XMLNodePrivate::IsValidXMLName(wchar_t *wszTagName)

{
  bool bVar1;
  int iVar2;
  wchar_t wVar3;
  byte bVar4;
  int i;
  ON_wString sTagName;
  ON_wString OStack_28;
  
  ON_wString::ON_wString(&OStack_28,wszTagName);
  bVar1 = ON_wString::IsEmpty(&OStack_28);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    iVar2 = ON_wString::Length(&OStack_28);
    if (iVar2 < 1) {
      bVar1 = true;
    }
    else {
      i = 0;
      bVar4 = 0;
      do {
        wVar3 = ON_wString::operator[](&OStack_28,i);
        if (((0x19 < (uint)(wVar3 + L'\xffffff9f')) &&
            (wVar3 != L'_' && 0x19 < (uint)(wVar3 + L'\xffffffbf'))) &&
           ((i == 0 || (1 < (uint)(wVar3 + L'\xffffffd3') && 9 < (uint)(wVar3 + L'\xffffffd0'))))) {
          bVar4 = 1;
        }
        i = i + 1;
      } while (iVar2 != i);
      bVar1 = (bool)(bVar4 ^ 1);
    }
  }
  ON_wString::~ON_wString(&OStack_28);
  return bVar1;
}

Assistant:

bool ON_XMLNodePrivate::IsValidXMLName(const wchar_t* wszTagName) // Static.
{
  // https://www.xml.com/pub/a/2001/07/25/namingparts.html
  //
  // A 'Name' is a token beginning with a letter or one of a few punctuation characters, and continuing with
  // letters, digits, hyphens, underscores, colons, or full stops, together known as name characters.
  // This definition is formally expressed in Extended Backus-Naur Form (EBNF) notation as follows:
  // 
  //  NameChar ::=  Letter | Digit | '.' | '-' | '_' | ':' | CombiningChar | Extender
  //  Name     ::= (Letter | '_' | ':') (NameChar)*

  // We also simplify as follows:
  //
  // - ':' is not actually allowed in tags, it's reserved for XML namespaces, so we disallow it.
  // - 'Letter' must be an ASCII letter: Letter ::= 'a' to 'z' or 'A' to 'Z'.
  // - 'Digit'  must be an ASCII digit:  Digit  ::= '0' to '9'.
  // - 'CombiningChar' and 'Extender' are not supported (disallowed).

  const ON_wString sTagName = wszTagName;
  if (sTagName.IsEmpty())
    return false;

  bool bad = false;

  const int len = sTagName.Length();
  for (int i = 0; i < len; i++)
  {
    const auto& ch = sTagName[i];

    if ((ch >= L'a') && (ch <= L'z'))
      continue;

    if ((ch >= L'A') && (ch <= L'Z'))
      continue;

    if (ch == L'_')
      continue;

    if (i > 0)
    {
      if ((ch >= L'0') && (ch <= L'9'))
        continue;

      if ((ch == '-') || (ch == '.'))
        continue;
    }

    bad = true;
  }

  if (bad)
  {
    return false;
  }

  return true;
}